

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  size_t __t;
  uint *__first;
  pointer p;
  size_t sVar1;
  uint *__result;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t size_local;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this_local;
  
  __t = detail::buffer<unsigned_int>::capacity(&this->super_buffer<unsigned_int>);
  old_data = (uint *)(__t + (__t >> 1));
  if (old_data < size) {
    old_data = (uint *)size;
  }
  __first = detail::buffer<unsigned_int>::data(&this->super_buffer<unsigned_int>);
  p = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                ((allocator_type *)&this->field_0xa0,(size_type)old_data);
  sVar1 = detail::buffer<unsigned_int>::size(&this->super_buffer<unsigned_int>);
  __result = detail::make_checked<unsigned_int>(p,(size_t)old_data);
  std::uninitialized_copy<unsigned_int*,unsigned_int*>(__first,__first + sVar1,__result);
  detail::buffer<unsigned_int>::set(&this->super_buffer<unsigned_int>,p,(size_t)old_data);
  if (__first != this->store_) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)&this->field_0xa0,__first,__t);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}